

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcase.hpp
# Opt level: O3

Dense<double> * generate_interaction<openjij::graph::Dense<double>>(void)

{
  double *pdVar1;
  Dense<double> *in_RDI;
  
  openjij::graph::Dense<double>::Dense(in_RDI,8);
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,0);
  *pdVar1 = -0.1;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,1);
  *pdVar1 = -0.9;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,2);
  *pdVar1 = 0.2;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,3);
  *pdVar1 = 0.1;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,4);
  *pdVar1 = 1.3;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,5);
  *pdVar1 = 0.8;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,6);
  *pdVar1 = 0.9;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,0,7);
  *pdVar1 = 0.4;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,1);
  *pdVar1 = -0.7;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,2);
  *pdVar1 = -1.6;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,3);
  *pdVar1 = 1.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,4);
  *pdVar1 = 1.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,5);
  *pdVar1 = 1.2;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,6);
  *pdVar1 = -1.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,1,7);
  *pdVar1 = -1.7;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,2);
  *pdVar1 = -0.6;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,3);
  *pdVar1 = 1.2;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,4);
  *pdVar1 = -1.3;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,5);
  *pdVar1 = -0.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,6);
  *pdVar1 = -1.9;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,2,7);
  *pdVar1 = 1.2;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,3,3);
  *pdVar1 = 0.8;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,3,4);
  *pdVar1 = -0.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,3,5);
  *pdVar1 = -0.4;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,3,6);
  *pdVar1 = -1.8;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,3,7);
  *pdVar1 = -2.0;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,4,4);
  *pdVar1 = 0.6;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,4,5);
  *pdVar1 = -2.0;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,4,6);
  *pdVar1 = -1.9;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,4,7);
  *pdVar1 = 0.5;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,5,5);
  *pdVar1 = -1.8;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,5,6);
  *pdVar1 = -1.2;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,5,7);
  *pdVar1 = 1.8;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,6,6);
  *pdVar1 = 0.3;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,6,7);
  *pdVar1 = 1.4;
  pdVar1 = openjij::graph::Dense<double>::J(in_RDI,7,7);
  *pdVar1 = 1.8;
  return in_RDI;
}

Assistant:

GraphType generate_interaction() {
    auto interaction = GraphType(num_system_size);
    interaction.J(0,0)=-0.1;
    interaction.J(0,1)=-0.9;
    interaction.J(0,2)=0.2;
    interaction.J(0,3)=0.1;
    interaction.J(0,4)=1.3;
    interaction.J(0,5)=0.8;
    interaction.J(0,6)=0.9;
    interaction.J(0,7)=0.4;
    interaction.J(1,1)=-0.7;
    interaction.J(1,2)=-1.6;
    interaction.J(1,3)=1.5;
    interaction.J(1,4)=1.5;
    interaction.J(1,5)=1.2;
    interaction.J(1,6)=-1.5;
    interaction.J(1,7)=-1.7;
    interaction.J(2,2)=-0.6;
    interaction.J(2,3)=1.2;
    interaction.J(2,4)=-1.3;
    interaction.J(2,5)=-0.5;
    interaction.J(2,6)=-1.9;
    interaction.J(2,7)=1.2;
    interaction.J(3,3)=0.8;
    interaction.J(3,4)=-0.5;
    interaction.J(3,5)=-0.4;
    interaction.J(3,6)=-1.8;
    interaction.J(3,7)=-2.0;
    interaction.J(4,4)=0.6;
    interaction.J(4,5)=-2.0;
    interaction.J(4,6)=-1.9;
    interaction.J(4,7)=0.5;
    interaction.J(5,5)=-1.8;
    interaction.J(5,6)=-1.2;
    interaction.J(5,7)=1.8;
    interaction.J(6,6)=0.3;
    interaction.J(6,7)=1.4;
    interaction.J(7,7)=1.8;
    return interaction;
}